

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvecs.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeFrhsXtra(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this)

{
  uint *puVar1;
  Status SVar2;
  pointer pnVar3;
  undefined8 uVar4;
  Item *pIVar5;
  int iVar6;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar7;
  cpp_dec_float<50U,_int,_void> *pcVar8;
  undefined8 *puVar9;
  long lVar10;
  cpp_dec_float<50U,_int,_void> *v;
  long lVar11;
  long lVar12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_108;
  cpp_dec_float<50U,_int,_void> local_c8;
  cpp_dec_float<50U,_int,_void> local_88;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_48;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_40;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_38;
  
  if ((this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .set.thenum < 1) {
    return;
  }
  local_48 = &(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .low;
  local_38 = &(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .up;
  lVar10 = 0;
  local_40 = this;
LAB_0023e520:
  SVar2 = (this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thedesc.colstat.data[lVar10];
  if (this->theRep * SVar2 < 1) {
    local_c8.fpclass = cpp_dec_float_finite;
    local_c8.prec_elem = 10;
    local_c8.data._M_elems[0] = 0;
    local_c8.data._M_elems[1] = 0;
    local_c8.data._M_elems[2] = 0;
    local_c8.data._M_elems[3] = 0;
    local_c8.data._M_elems[4] = 0;
    local_c8.data._M_elems[5] = 0;
    local_c8.data._M_elems._24_5_ = 0;
    local_c8.data._M_elems[7]._1_3_ = 0;
    local_c8.data._M_elems._32_5_ = 0;
    local_c8.data._M_elems[9]._1_3_ = 0;
    local_c8.exp = 0;
    local_c8.neg = false;
    pVVar7 = local_38;
    switch(SVar2) {
    case P_FIXED:
    case P_ON_UPPER:
      goto switchD_0023e57e_caseD_fffffffa;
    default:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"ESVECS02 ERROR: ",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"inconsistent basis must not happen!",0x23);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_108.data._M_elems._0_8_ = local_108.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,"XSVECS02 This should never happen.","");
      *puVar9 = &PTR__SPxException_006a9ee8;
      puVar9[1] = puVar9 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar9 + 1),local_108.data._M_elems._0_8_,
                 local_108.data._M_elems._0_8_ + local_108.data._M_elems._8_8_);
      *puVar9 = &PTR__SPxException_006a9ec0;
      __cxa_throw(puVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_LOWER:
      goto switchD_0023e57e_caseD_fffffffc;
    case P_FREE:
      break;
    }
  }
switchD_0023e57e_caseD_ffffffff:
  lVar10 = lVar10 + 1;
  if ((this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .set.thenum <= lVar10) {
    return;
  }
  goto LAB_0023e520;
switchD_0023e57e_caseD_fffffffc:
  pVVar7 = local_48;
switchD_0023e57e_caseD_fffffffa:
  pnVar3 = (pVVar7->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = *(undefined8 *)((long)&pnVar3[lVar10].m_backend.data + 0x20);
  local_c8.data._M_elems._32_5_ = SUB85(uVar4,0);
  local_c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
  local_c8.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[lVar10].m_backend.data;
  local_c8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[lVar10].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar3[lVar10].m_backend.data + 0x10);
  local_c8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  uVar4 = *(undefined8 *)(puVar1 + 2);
  local_c8.data._M_elems._24_5_ = SUB85(uVar4,0);
  local_c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
  local_c8.exp = pnVar3[lVar10].m_backend.exp;
  local_c8.neg = pnVar3[lVar10].m_backend.neg;
  local_c8.fpclass = pnVar3[lVar10].m_backend.fpclass;
  local_c8.prec_elem = pnVar3[lVar10].m_backend.prec_elem;
  if (local_c8.fpclass != cpp_dec_float_NaN) {
    local_108.fpclass = cpp_dec_float_finite;
    local_108.prec_elem = 10;
    local_108.data._M_elems[0] = 0;
    local_108.data._M_elems[1] = 0;
    local_108.data._M_elems[2] = 0;
    local_108.data._M_elems[3] = 0;
    local_108.data._M_elems[4] = 0;
    local_108.data._M_elems[5] = 0;
    local_108.data._M_elems._24_5_ = 0;
    local_108.data._M_elems[7]._1_3_ = 0;
    local_108.data._M_elems._32_5_ = 0;
    local_108.data._M_elems[9]._1_3_ = 0;
    local_108.exp = 0;
    local_108.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_108,0.0);
    iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                      (&local_c8,&local_108);
    if (iVar6 == 0) goto switchD_0023e57e_caseD_ffffffff;
  }
  pVVar7 = this->theFrhs;
  local_88.data._M_elems[7]._1_3_ = local_c8.data._M_elems[7]._1_3_;
  local_88.data._M_elems._24_5_ = local_c8.data._M_elems._24_5_;
  local_88.data._M_elems[0] = local_c8.data._M_elems[0];
  local_88.data._M_elems[1] = local_c8.data._M_elems[1];
  local_88.data._M_elems[2] = local_c8.data._M_elems[2];
  local_88.data._M_elems[3] = local_c8.data._M_elems[3];
  local_88.data._M_elems[9]._1_3_ = local_c8.data._M_elems[9]._1_3_;
  local_88.data._M_elems._32_5_ = local_c8.data._M_elems._32_5_;
  local_88.data._M_elems[4] = local_c8.data._M_elems[4];
  local_88.data._M_elems[5] = local_c8.data._M_elems[5];
  local_88.exp = local_c8.exp;
  local_88.neg = local_c8.neg;
  local_88.fpclass = local_c8.fpclass;
  local_88.prec_elem = local_c8.prec_elem;
  if (local_c8.fpclass != cpp_dec_float_finite || local_c8.data._M_elems[0] != 0) {
    local_88.neg = (bool)(local_c8.neg ^ 1);
  }
  pIVar5 = (this->thevectors->set).theitem;
  iVar6 = (this->thevectors->set).thekey[lVar10].idx;
  lVar11 = (long)pIVar5[iVar6].data.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
  this = local_40;
  if (0 < lVar11) {
    pIVar5 = pIVar5 + iVar6;
    lVar12 = lVar11 + 1;
    lVar11 = lVar11 * 0x3c;
    do {
      pcVar8 = (cpp_dec_float<50U,_int,_void> *)
               ((long)&(pIVar5->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem[-1].val.m_backend.data + lVar11);
      local_108.fpclass = cpp_dec_float_finite;
      local_108.prec_elem = 10;
      local_108.data._M_elems[0] = 0;
      local_108.data._M_elems[1] = 0;
      local_108.data._M_elems[2] = 0;
      local_108.data._M_elems[3] = 0;
      local_108.data._M_elems[4] = 0;
      local_108.data._M_elems[5] = 0;
      local_108.data._M_elems._24_5_ = 0;
      local_108.data._M_elems[7]._1_3_ = 0;
      local_108.data._M_elems._32_5_ = 0;
      local_108.data._M_elems[9]._1_3_ = 0;
      local_108.exp = 0;
      local_108.neg = false;
      v = &local_88;
      if (pcVar8 != &local_108) {
        local_108.data._M_elems._32_5_ = local_88.data._M_elems._32_5_;
        local_108.data._M_elems[9]._1_3_ = local_88.data._M_elems[9]._1_3_;
        local_108.data._M_elems[1] = local_88.data._M_elems[1];
        local_108.data._M_elems[0] = local_88.data._M_elems[0];
        local_108.data._M_elems._8_8_ =
             CONCAT44(local_88.data._M_elems[3],local_88.data._M_elems[2]);
        local_108.data._M_elems[4] = local_88.data._M_elems[4];
        local_108.data._M_elems[5] = local_88.data._M_elems[5];
        local_108.data._M_elems._24_5_ = local_88.data._M_elems._24_5_;
        local_108.data._M_elems[7]._1_3_ = local_88.data._M_elems[7]._1_3_;
        local_108.exp = local_88.exp;
        local_108.neg = local_88.neg;
        local_108.fpclass = local_88.fpclass;
        local_108.prec_elem = local_88.prec_elem;
        v = pcVar8;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_108,v);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&(pVVar7->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start
                  [*(int *)((long)(&(pIVar5->data).
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem[-1].val + 1) + lVar11)].m_backend,&local_108);
      lVar12 = lVar12 + -1;
      this = local_40;
      lVar11 = lVar11 + -0x3c;
    } while (1 < lVar12);
  }
  goto switchD_0023e57e_caseD_ffffffff;
}

Assistant:

void SPxSolverBase<R>::computeFrhsXtra()
{

   assert(rep()  == COLUMN);
   assert(type() == LEAVE);

   for(int i = 0; i < this->nCols(); ++i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = this->desc().colStatus(i);

      if(!isBasic(stat))
      {
         R x;

         // coverity[switch_selector_expr_is_constant]
         switch(stat)
         {
         // columnwise cases:
         case SPxBasisBase<R>::Desc::P_FREE :
            continue;

         case(SPxBasisBase<R>::Desc::P_FIXED) :
            assert(EQ(SPxLPBase<R>::lower(i), SPxLPBase<R>::upper(i), this->epsilon()));

         //lint -fallthrough
         case SPxBasisBase<R>::Desc::P_ON_UPPER :
            x = SPxLPBase<R>::upper(i);
            break;

         case SPxBasisBase<R>::Desc::P_ON_LOWER :
            x = SPxLPBase<R>::lower(i);
            break;

         default:
            SPX_MSG_ERROR(std::cerr << "ESVECS02 ERROR: "
                          << "inconsistent basis must not happen!"
                          << std::endl;)
            throw SPxInternalCodeException("XSVECS02 This should never happen.");
         }

         assert(x < R(infinity));
         assert(x > R(-infinity));

         if(x != 0.0)
            theFrhs->multAdd(-x, vector(i));
      }
   }
}